

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

Value * __thiscall
soul::Value::createArrayOrVector
          (Value *__return_storage_ptr__,Value *this,Type *t,ArrayView<soul::Value> elements)

{
  ArrayView<soul::Value> values;
  PackedData local_50;
  Type local_38;
  
  local_38.category = (this->type).category;
  local_38.arrayElementCategory = (this->type).arrayElementCategory;
  local_38.isRef = (this->type).isRef;
  local_38.isConstant = (this->type).isConstant;
  local_38.primitiveType.type = (this->type).primitiveType.type;
  local_38.boundingSize = (this->type).boundingSize;
  local_38.arrayElementBoundingSize = (this->type).arrayElementBoundingSize;
  local_38.structure.object = (this->type).structure.object;
  (this->type).structure.object = (Structure *)0x0;
  Value(__return_storage_ptr__,&local_38);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_38.structure);
  getData(&local_50,__return_storage_ptr__);
  values.e = elements.s;
  values.s = (Value *)t;
  PackedData::setFrom(&local_50,values);
  return __return_storage_ptr__;
}

Assistant:

Value Value::createArrayOrVector (Type t, ArrayView<Value> elements)
{
    Value v (std::move (t));
    v.getData().setFrom (elements);
    return v;
}